

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall
QIconModeViewBase::doDynamicLayout(QIconModeViewBase *this,QListViewLayoutInfo *info)

{
  QSize *pQVar1;
  Representation *pRVar2;
  Representation RVar3;
  Representation RVar4;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_00;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_01;
  QListViewPrivate *pQVar5;
  QAbstractItemModel *pQVar6;
  QListViewItem *pQVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  char cVar11;
  P _a;
  int iVar12;
  int iVar13;
  int iVar14;
  QSize QVar15;
  long lVar16;
  pointer pQVar17;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar18;
  int *piVar19;
  QSize QVar20;
  QSize QVar21;
  short sVar22;
  int iVar23;
  Representation RVar24;
  QListViewLayoutInfo *pQVar25;
  int iVar26;
  QSize *pQVar27;
  QSize *pQVar28;
  QSize *pQVar29;
  char *pcVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  long in_FS_OFFSET;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  Bucket BVar38;
  QRect QVar39;
  int local_fc;
  QPoint *local_f8;
  ulong local_e8;
  QRect local_98;
  QPersistentModelIndex local_80;
  QModelIndex local_78;
  QPoint local_58;
  undefined8 uStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &info->grid;
  pRVar2 = &(info->grid).ht;
  bVar37 = -1 < ((info->grid).ht.m_i | (info->grid).wd.m_i);
  QVar15 = (QSize)initDynamicLayout(this,info);
  local_e8 = (ulong)QVar15 >> 0x20;
  local_fc = (int)QVar15.ht.m_i;
  if (info->flow == LeftToRight) {
    lVar16 = 8;
    local_e8 = (ulong)QVar15 & 0xffffffff;
    pQVar25 = info;
    pQVar27 = pQVar1;
    pQVar28 = (QSize *)pRVar2;
  }
  else {
    lVar16 = 0xc;
    pQVar25 = (QListViewLayoutInfo *)&(info->bounds).y1;
    pQVar27 = (QSize *)pRVar2;
    pQVar28 = pQVar1;
    local_fc = (int)QVar15.wd.m_i;
  }
  pQVar29 = (QSize *)&(this->super_QCommonListViewBase).batchSavedDeltaSeg;
  if (bVar37) {
    pQVar29 = pQVar28;
  }
  pcVar30 = (this->moved).d.d.ptr;
  if (pcVar30 == (char *)0x0) {
    pcVar30 = (char *)&QByteArray::_empty;
  }
  iVar31 = info->spacing + (pQVar25->bounds).x1.m_i;
  iVar14 = (pQVar29->wd).m_i;
  iVar26 = *(int *)((long)&(info->bounds).x1.m_i + lVar16);
  iVar32 = (pQVar27->wd).m_i;
  if ((this->moved).d.d.size * 8 - (long)*pcVar30 != (this->items).d.size) {
    QBitArray::resize((longlong)&this->moved);
  }
  auVar9._8_8_ = 0;
  auVar9._0_4_ = QVar15.wd.m_i;
  auVar9._4_4_ = QVar15.ht.m_i;
  auVar8._8_8_ = 0;
  auVar8._0_4_ = QVar15.wd.m_i;
  auVar8._4_4_ = QVar15.ht.m_i;
  QVar39 = (QRect)(auVar8 << 0x40);
  iVar12 = info->first;
  iVar13 = info->last;
  if (iVar13 < iVar12) {
    local_f8 = (QPoint *)0x0;
    QVar39 = (QRect)(auVar9 << 0x40);
  }
  else {
    lVar16 = (long)iVar12;
    lVar10 = (long)iVar12 * 0x14 + -0x14;
    do {
      lVar34 = lVar10;
      local_98 = QVar39;
      pQVar17 = QList<QListViewItem>::data(&this->items);
      pQVar5 = (this->super_QCommonListViewBase).dd;
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = (pQVar5->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_58,&(pQVar5->super_QAbstractItemViewPrivate).root);
      bVar35 = false;
      (**(code **)(*(long *)pQVar6 + 0x60))(&local_78,pQVar6,lVar16,0);
      auVar8 = (undefined1  [16])local_78._0_16_;
      local_48.ptr = local_78.m.ptr;
      local_58.xp.m_i = local_78.r;
      local_58.yp.m_i = local_78.c;
      uStack_50 = local_78.i;
      this_00 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  **)(*(long *)((pQVar5->super_QAbstractItemViewPrivate).model + 8) + 0x90);
      local_78._0_16_ = auVar8;
      if (this_00 !=
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *)0x0) {
        BVar38 = QHashPrivate::
                 Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 ::findBucket<QtPrivate::QModelIndexWrapper>
                           (this_00,(QModelIndexWrapper *)&local_58);
        if (BVar38.span[BVar38.index] == (Span)0xff) {
          bVar35 = false;
        }
        else {
          bVar35 = *(long *)(BVar38.span + 0x80) != 0;
        }
      }
      if (bVar35) {
        QPersistentModelIndex::QPersistentModelIndex(&local_80,&local_78);
        this_01 = (pQVar5->hiddenRows).q_hash.d;
        if (this_01 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
        goto LAB_0057ee6e;
        pNVar18 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                  findNode<QPersistentModelIndex>(this_01,&local_80);
        bVar36 = pNVar18 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
      }
      else {
LAB_0057ee6e:
        bVar36 = false;
      }
      QVar39 = local_98;
      if (bVar35) {
        QPersistentModelIndex::~QPersistentModelIndex(&local_80);
        QVar39 = local_98;
      }
      if (bVar36) {
        *(undefined8 *)((long)&pQVar17[1].x + lVar34) = 0xffffffffffffffff;
        *(undefined4 *)((long)&pQVar17[1].w + lVar34) = 0;
      }
      else {
        if (bVar37) {
          iVar12 = (pQVar1->wd).m_i;
          sVar22 = *(short *)((long)&pQVar17[1].w + lVar34);
          if (iVar12 < sVar22) {
            sVar22 = (short)iVar12;
          }
          *(short *)((long)&pQVar17[1].w + lVar34) = sVar22;
          sVar22 = *(short *)((long)&pQVar17[1].h + lVar34);
          if (pRVar2->m_i < (int)sVar22) {
            sVar22 = (short)pRVar2->m_i;
          }
          *(short *)((long)&pQVar17[1].h + lVar34) = sVar22;
          iVar12 = iVar14;
        }
        else {
          if (info->flow == LeftToRight) {
            sVar22 = *(short *)((long)&pQVar17[1].w + lVar34);
          }
          else {
            sVar22 = *(short *)((long)&pQVar17[1].h + lVar34);
          }
          iVar32 = (int)sVar22 + info->spacing;
          iVar12 = 0;
        }
        iVar13 = iVar14;
        RVar24.m_i = iVar31;
        if ((iVar26 < (int)local_e8 + iVar32 & info->wrap & iVar31 < (int)local_e8) == 0) {
          iVar13 = 0;
          iVar12 = iVar14;
          RVar24.m_i = (int)local_e8;
        }
        iVar14 = iVar12;
        if ((!bVar37) &&
           (iVar23 = (int)*(short *)((long)&pQVar17[1].w +
                                    (ulong)(info->flow == LeftToRight) * 2 + lVar34) + info->spacing
           , iVar12 <= iVar23)) {
          iVar14 = iVar23;
        }
        local_fc = iVar13 + local_fc;
        if (((byte)(this->moved).d.d.ptr[(lVar16 >> 3) + 1] >> ((uint)lVar16 & 7) & 1) == 0) {
          piVar19 = (int *)((long)&pQVar17[1].x + lVar34);
          if (info->flow == LeftToRight) {
            if (bVar37) {
              *(int *)((long)&pQVar17[1].x + lVar34) =
                   (iVar32 - *(short *)((long)&pQVar17[1].w + lVar34)) / 2 + RVar24.m_i;
            }
            else {
              *piVar19 = RVar24.m_i;
            }
            piVar19 = &pQVar17[lVar16].y;
          }
          else if (bVar37) {
            *(int *)((long)&pQVar17[1].y + lVar34) =
                 (iVar32 - *(short *)((long)&pQVar17[1].h + lVar34)) / 2 + RVar24.m_i;
          }
          else {
            *(int *)((long)&pQVar17[1].y + lVar34) = RVar24.m_i;
          }
          *piVar19 = local_fc;
        }
        if (bVar37) {
          if (info->flow == LeftToRight) {
            local_58.yp.m_i = local_fc;
            local_58.xp.m_i = RVar24.m_i;
            iVar12 = RVar24.m_i + iVar32;
            iVar13 = iVar14 + local_fc;
          }
          else {
            local_58.yp.m_i = RVar24.m_i;
            local_58.xp.m_i = local_fc;
            iVar12 = iVar14 + local_fc;
            iVar13 = RVar24.m_i + iVar32;
          }
          uStack_50 = CONCAT44(iVar13 + -1,iVar12 + -1);
        }
        else {
          RVar4.m_i = *(int *)((long)&pQVar17[1].x + lVar34);
          RVar3.m_i = *(int *)((long)&pQVar17[1].y + lVar34);
          local_58.yp.m_i = RVar3.m_i;
          local_58.xp.m_i = RVar4.m_i;
          uStack_50 = CONCAT44(*(short *)((long)&pQVar17[1].h + lVar34) + RVar3.m_i + -1,
                               *(short *)((long)&pQVar17[1].w + lVar34) + RVar4.m_i + -1);
        }
        local_98 = QVar39;
        QVar39 = (QRect)QRect::operator|(&local_98,(QRect *)&local_58);
        local_e8 = (ulong)(uint)(RVar24.m_i + iVar32);
      }
      iVar13 = info->last;
      bVar35 = lVar16 < iVar13;
      lVar16 = lVar16 + 1;
      lVar10 = lVar34 + 0x14;
    } while (bVar35);
    local_f8 = (QPoint *)((long)&pQVar17[1].x + lVar34);
  }
  (this->super_QCommonListViewBase).batchSavedDeltaSeg = iVar14;
  (this->super_QCommonListViewBase).batchStartRow = iVar13 + 1;
  pQVar5 = (this->super_QCommonListViewBase).dd;
  pQVar6 = (pQVar5->super_QAbstractItemViewPrivate).model;
  local_98 = QVar39;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_58,&(pQVar5->super_QAbstractItemViewPrivate).root);
  iVar14 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,(QModelIndex *)&local_58);
  if (iVar13 < iVar14 + -1) {
    local_58.xp.m_i = (local_f8->xp).m_i;
    local_58.yp.m_i = (local_f8->yp).m_i;
    uStack_50 = CONCAT44((int)*(short *)((long)&(((QSize *)(local_f8 + 1))->wd).m_i + 2) +
                         (local_f8->yp).m_i + -1,
                         (int)(short)(((QSize *)(local_f8 + 1))->wd).m_i + (local_f8->xp).m_i + -1);
    cVar11 = QRect::contains(&info->bounds,SUB81(&local_58,0));
    if (cVar11 != '\0') goto LAB_0057f1a4;
  }
  QVar20.wd.m_i = (local_98.x2.m_i - local_98.x1.m_i) + 1;
  QVar20.ht.m_i = (local_98.y2.m_i - local_98.y1.m_i) + 1;
  (this->super_QCommonListViewBase).contentsSize = QVar20;
  if (info->flow == LeftToRight) {
    pRVar2 = &(this->super_QCommonListViewBase).contentsSize.ht;
    pRVar2->m_i = pRVar2->m_i + info->spacing;
  }
  else {
    pQVar1 = &(this->super_QCommonListViewBase).contentsSize;
    (pQVar1->wd).m_i = (pQVar1->wd).m_i + info->spacing;
  }
LAB_0057f1a4:
  QVar21.wd.m_i = (local_98.x2.m_i - local_98.x1.m_i) + 1;
  RVar24.m_i = (local_98.y2.m_i - local_98.y1.m_i) + 1;
  if (0 < RVar24.m_i && 0 < QVar21.wd.m_i) {
    iVar26 = info->first;
    if (iVar26 == 0 || iVar14 + -1 <= iVar13) {
      QVar21.ht.m_i = RVar24.m_i;
      local_58 = (QPoint)QVar21;
      initBspTree(this,(QSize *)&local_58);
      iVar26 = 0;
    }
    QVar39 = local_98;
    if (iVar26 <= info->last) {
      lVar16 = (long)iVar26 * 0x14 + 10;
      uVar33 = (long)iVar26;
      do {
        pQVar7 = (this->items).d.ptr;
        RVar24.m_i = *(int *)((long)pQVar7 + lVar16 + -10);
        RVar4.m_i = *(int *)((long)pQVar7 + lVar16 + -6);
        local_58.yp.m_i = RVar4.m_i;
        local_58.xp.m_i = RVar24.m_i;
        uStack_50 = CONCAT44(*(short *)((long)&pQVar7->x + lVar16) + RVar4.m_i + -1,
                             *(short *)((long)pQVar7 + lVar16 + -2) + RVar24.m_i + -1);
        QBspTree::climbTree(&this->tree,(QRect *)&local_58,QBspTree::insert,
                            (QBspTreeData)(uVar33 & 0xffffffff),0);
        lVar16 = lVar16 + 0x14;
        bVar37 = (long)uVar33 < (long)info->last;
        uVar33 = uVar33 + 1;
        QVar39 = local_98;
      } while (bVar37);
    }
    local_98._8_8_ = QVar39._8_8_;
    uStack_50._0_4_ = local_98.x2.m_i;
    uStack_50._4_4_ = local_98.y2.m_i;
    local_58 = (QPoint)QVar15;
    local_98 = QVar39;
    local_78._0_16_ =
         QWidgetPrivate::clipRect((QWidgetPrivate *)(this->super_QCommonListViewBase).dd);
    cVar11 = QRect::intersects((QRect *)&local_78);
    if (cVar11 != '\0') {
      QWidget::update((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                      super_QAbstractScrollAreaPrivate.viewport);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconModeViewBase::doDynamicLayout(const QListViewLayoutInfo &info)
{
    const bool useItemSize = !info.grid.isValid();
    const QPoint topLeft = initDynamicLayout(info);

    int segStartPosition;
    int segEndPosition;
    int deltaFlowPosition;
    int deltaSegPosition;
    int deltaSegHint;
    int flowPosition;
    int segPosition;

    if (info.flow == QListView::LeftToRight) {
        segStartPosition = info.bounds.left() + info.spacing;
        segEndPosition = info.bounds.right();
        deltaFlowPosition = info.grid.width(); // dx
        deltaSegPosition = (useItemSize ? batchSavedDeltaSeg : info.grid.height()); // dy
        deltaSegHint = info.grid.height();
        flowPosition = topLeft.x();
        segPosition = topLeft.y();
    } else { // flow == QListView::TopToBottom
        segStartPosition = info.bounds.top() + info.spacing;
        segEndPosition = info.bounds.bottom();
        deltaFlowPosition = info.grid.height(); // dy
        deltaSegPosition = (useItemSize ? batchSavedDeltaSeg : info.grid.width()); // dx
        deltaSegHint = info.grid.width();
        flowPosition = topLeft.y();
        segPosition = topLeft.x();
    }

    if (moved.size() != items.size())
        moved.resize(items.size());

    QRect rect(QPoint(), topLeft);
    QListViewItem *item = nullptr;
    Q_ASSERT(info.first <= info.last);
    for (int row = info.first; row <= info.last; ++row) {
        item = &items[row];
        if (isHidden(row)) {
            item->invalidate();
        } else {
            // if we are not using a grid, we need to find the deltas
            if (useItemSize) {
                if (info.flow == QListView::LeftToRight)
                    deltaFlowPosition = item->w + info.spacing;
                else
                    deltaFlowPosition = item->h + info.spacing;
            } else {
                item->w = qMin<int>(info.grid.width(), item->w);
                item->h = qMin<int>(info.grid.height(), item->h);
            }

            // create new segment
            if (info.wrap
                && flowPosition + deltaFlowPosition > segEndPosition
                && flowPosition > segStartPosition) {
                flowPosition = segStartPosition;
                segPosition += deltaSegPosition;
                if (useItemSize)
                    deltaSegPosition = 0;
            }
            // We must delay calculation of the seg adjustment, as this item
            // may have caused a wrap to occur
            if (useItemSize) {
                if (info.flow == QListView::LeftToRight)
                    deltaSegHint = item->h + info.spacing;
                else
                    deltaSegHint = item->w + info.spacing;
                deltaSegPosition = qMax(deltaSegPosition, deltaSegHint);
            }

            // set the position of the item
            // ### idealy we should have some sort of alignment hint for the item
            // ### (normally that would be a point between the icon and the text)
            if (!moved.testBit(row)) {
                if (info.flow == QListView::LeftToRight) {
                    if (useItemSize) {
                        item->x = flowPosition;
                        item->y = segPosition;
                    } else { // use grid
                        item->x = flowPosition + ((deltaFlowPosition - item->w) / 2);
                        item->y = segPosition;
                    }
                } else { // TopToBottom
                    if (useItemSize) {
                        item->y = flowPosition;
                        item->x = segPosition;
                    } else { // use grid
                        item->y = flowPosition + ((deltaFlowPosition - item->h) / 2);
                        item->x = segPosition;
                    }
                }
            }

            // let the contents contain the new item
            if (useItemSize)
                rect |= item->rect();
            else if (info.flow == QListView::LeftToRight)
                rect |= QRect(flowPosition, segPosition, deltaFlowPosition, deltaSegPosition);
            else // flow == TopToBottom
                rect |= QRect(segPosition, flowPosition, deltaSegPosition, deltaFlowPosition);

            // prepare for next item
            flowPosition += deltaFlowPosition; // current position + item width + gap
        }
    }
    Q_ASSERT(item);
    batchSavedDeltaSeg = deltaSegPosition;
    batchStartRow = info.last + 1;
    bool done = (info.last >= rowCount() - 1);
    // resize the content area
    if (done || !info.bounds.contains(item->rect())) {
        contentsSize = rect.size();
        if (info.flow == QListView::LeftToRight)
            contentsSize.rheight() += info.spacing;
        else
            contentsSize.rwidth() += info.spacing;
    }
    if (rect.size().isEmpty())
        return;
    // resize tree
    int insertFrom = info.first;
    if (done || info.first == 0) {
        initBspTree(rect.size());
        insertFrom = 0;
    }
    // insert items in tree
    for (int row = insertFrom; row <= info.last; ++row)
        tree.insertLeaf(items.at(row).rect(), row);
    // if the new items are visible, update the viewport
    QRect changedRect(topLeft, rect.bottomRight());
    if (clipRect().intersects(changedRect))
        viewport()->update();
}